

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_evaluator.cpp
# Opt level: O3

void __thiscall
TestEvaluator_TestReturnStmt_Test::~TestEvaluator_TestReturnStmt_Test
          (TestEvaluator_TestReturnStmt_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestEvaluator, TestReturnStmt){
    cout << R"(
                ----- test_returnstmt -----
               )" << endl;
    string buff = R"(
                    return 22
                    init a = 90
                    return a
                    return invalid_variable
                    )";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto env = Evaluator::NewEnvironment();
    auto program = parser->parseProgram();
    auto obj = Evaluator::evalProgram(program, env);
    EXPECT_TRUE(!obj.empty());
    EXPECT_EQ(obj.size(), 4);
}